

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O0

int armci_stride_info_seg_off(stride_info_t *sinfo)

{
  long in_RDI;
  int off;
  int i;
  int local_10;
  int local_c;
  
  if (in_RDI != 0) {
    local_10 = 0;
    for (local_c = 0; local_c < *(int *)(in_RDI + 8); local_c = local_c + 1) {
      local_10 = *(int *)(in_RDI + 0x58 + (long)local_c * 4) *
                 *(int *)(in_RDI + 0xc + (long)local_c * 4) + local_10;
    }
    return local_10;
  }
  __assert_fail("sinfo!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                ,0x89,"int armci_stride_info_seg_off(stride_info_t *)");
}

Assistant:

int armci_stride_info_seg_off(stride_info_t *sinfo) {
  int i;
  int off;
  assert(sinfo!=NULL);
  
  off=0;
  for(i=0; i<sinfo->stride_levels; i++) {
    off += sinfo->itr[i] * sinfo->stride_arr[i];
  }
  return off;
}